

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::ContinuousAssignSymbol::getAssignment(ContinuousAssignSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  LookupLocation LVar4;
  ASTContext context;
  Scope *local_50;
  uint32_t local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (this->assign != (Expression *)0x0) {
    return this->assign;
  }
  pSVar1 = (this->super_Symbol).parentScope;
  pSVar2 = (this->super_Symbol).originatingSyntax;
  LVar4 = LookupLocation::after(&this->super_Symbol);
  local_48 = LVar4.index;
  local_40 = 0x20;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_50 = pSVar1;
  iVar3 = Expression::bind((int)pSVar2,(sockaddr *)&local_50,8);
  this->assign = (Expression *)CONCAT44(extraout_var,iVar3);
  return (Expression *)CONCAT44(extraout_var,iVar3);
}

Assistant:

const Expression& ContinuousAssignSymbol::getAssignment() const {
    if (assign)
        return *assign;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    ASTContext context(*scope, LookupLocation::after(*this), ASTFlags::NonProcedural);
    assign = &Expression::bind(syntax->as<ExpressionSyntax>(), context,
                               ASTFlags::AssignmentAllowed);

    return *assign;
}